

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveExecutablePathDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *path,
          bool *resolved)

{
  bool bVar1;
  ulong uVar2;
  bool *resolved_local;
  string *path_local;
  string *executablePath_local;
  string *name_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)path,(string *)name);
    std::__cxx11::string::replace((ulong)path,0,(string *)0x10);
    bVar1 = cmsys::SystemTools::PathExists(path);
    if (bVar1) {
      *resolved = true;
    }
    else {
      *resolved = false;
    }
  }
  else {
    *resolved = false;
  }
  return true;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveExecutablePathDependency(
  std::string const& name, std::string const& executablePath,
  std::string& path, bool& resolved)
{
  if (executablePath.empty()) {
    resolved = false;
    return true;
  }

  // 16 is == "@executable_path".length()
  path = name;
  path.replace(0, 16, executablePath);

  if (!cmSystemTools::PathExists(path)) {
    resolved = false;
    return true;
  }

  resolved = true;
  return true;
}